

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseAssertReturnCommand(WastParser *this,CommandPtr *out_command)

{
  bool bVar1;
  Result RVar2;
  pointer pAVar3;
  unique_ptr<wabt::AssertReturnCommand,_std::default_delete<wabt::AssertReturnCommand>_> local_30;
  unique_ptr<wabt::AssertReturnCommand,_std::default_delete<wabt::AssertReturnCommand>_> command;
  CommandPtr *out_command_local;
  WastParser *this_local;
  
  command._M_t.
  super___uniq_ptr_impl<wabt::AssertReturnCommand,_std::default_delete<wabt::AssertReturnCommand>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::AssertReturnCommand_*,_std::default_delete<wabt::AssertReturnCommand>_>
  .super__Head_base<0UL,_wabt::AssertReturnCommand_*,_false>._M_head_impl._4_4_ = Expect(this,Lpar);
  bVar1 = Failed(command._M_t.
                 super___uniq_ptr_impl<wabt::AssertReturnCommand,_std::default_delete<wabt::AssertReturnCommand>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::AssertReturnCommand_*,_std::default_delete<wabt::AssertReturnCommand>_>
                 .super__Head_base<0UL,_wabt::AssertReturnCommand_*,_false>._M_head_impl._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    command._M_t.
    super___uniq_ptr_impl<wabt::AssertReturnCommand,_std::default_delete<wabt::AssertReturnCommand>_>
    ._M_t.
    super__Tuple_impl<0UL,_wabt::AssertReturnCommand_*,_std::default_delete<wabt::AssertReturnCommand>_>
    .super__Head_base<0UL,_wabt::AssertReturnCommand_*,_false>._M_head_impl._0_4_ =
         Expect(this,AssertReturn);
    bVar1 = Failed(command._M_t.
                   super___uniq_ptr_impl<wabt::AssertReturnCommand,_std::default_delete<wabt::AssertReturnCommand>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wabt::AssertReturnCommand_*,_std::default_delete<wabt::AssertReturnCommand>_>
                   .super__Head_base<0UL,_wabt::AssertReturnCommand_*,_false>._M_head_impl._0_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      MakeUnique<wabt::AssertReturnCommand>();
      pAVar3 = std::
               unique_ptr<wabt::AssertReturnCommand,_std::default_delete<wabt::AssertReturnCommand>_>
               ::operator->(&local_30);
      RVar2 = ParseAction(this,&pAVar3->action);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        pAVar3 = std::
                 unique_ptr<wabt::AssertReturnCommand,_std::default_delete<wabt::AssertReturnCommand>_>
                 ::operator->(&local_30);
        RVar2 = ParseConstList(this,&pAVar3->expected,Expectation);
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          RVar2 = Expect(this,Rpar);
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
          else {
            std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>::operator=
                      ((unique_ptr<wabt::Command,std::default_delete<wabt::Command>> *)out_command,
                       &local_30);
            Result::Result((Result *)((long)&this_local + 4),Ok);
          }
        }
      }
      std::unique_ptr<wabt::AssertReturnCommand,_std::default_delete<wabt::AssertReturnCommand>_>::
      ~unique_ptr(&local_30);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseAssertReturnCommand(CommandPtr* out_command) {
  WABT_TRACE(ParseAssertReturnCommand);
  EXPECT(Lpar);
  EXPECT(AssertReturn);
  auto command = MakeUnique<AssertReturnCommand>();
  CHECK_RESULT(ParseAction(&command->action));
  CHECK_RESULT(ParseConstList(&command->expected, ConstType::Expectation));
  EXPECT(Rpar);
  *out_command = std::move(command);
  return Result::Ok;
}